

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AnonymousProgramSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AnonymousProgramSymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  SourceLocation SVar1;
  AnonymousProgramSymbol *thisSym_;
  
  thisSym_ = (AnonymousProgramSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AnonymousProgramSymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (AnonymousProgramSymbol *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  SVar1 = *args_1;
  (thisSym_->super_Symbol).kind = AnonymousProgram;
  (thisSym_->super_Symbol).name._M_len = 0;
  (thisSym_->super_Symbol).name._M_str = "";
  (thisSym_->super_Symbol).location = SVar1;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }